

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::removeBall(Map *this,int n)

{
  int local_18;
  int i;
  int n_local;
  Map *this_local;
  
  if (this->ball[n] != (Ball *)0x0) {
    for (local_18 = 0; local_18 < 0x1e; local_18 = local_18 + 1) {
      if ((this->palette->dockedBalls[local_18] != (Ball *)0x0) &&
         (this->palette->dockedBalls[local_18] == this->ball[n])) {
        this->palette->dockedBalls[local_18] = (Ball *)0x0;
      }
    }
    if (this->ball[n] != (Ball *)0x0) {
      operator_delete(this->ball[n],0x14);
    }
    this->ball[n] = (Ball *)0x0;
    this->balls = this->balls + -1;
  }
  return;
}

Assistant:

void Map::removeBall(int n){
    if(ball[n]){
        for(int i=0; i<MAX_BALLS; i++){
            if(palette->dockedBalls[i] && palette->dockedBalls[i] == ball[n]){
                palette->dockedBalls[i] = nullptr;
            }
        }

        delete(ball[n]);
        ball[n] = nullptr;
        balls--;
    }
}